

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_obj.c
# Opt level: O0

mesh * build_mesh_from_obj_model(obj_model *model)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  _Bool _Var6;
  size_t sVar7;
  size_t sVar8;
  mesh *mesh_00;
  long *plVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  void *local_108;
  size_t i2_1;
  size_t m_1;
  size_t j_2;
  size_t i3;
  size_t i2;
  size_t m;
  size_t j_1;
  size_t i1;
  size_t i0;
  obj_face *face;
  size_t n_1;
  size_t k;
  size_t i_1;
  obj_index *obj_index;
  size_t j;
  size_t n;
  size_t i;
  vec2 *tex_coords;
  vec3 *normals;
  vec3 *vertices;
  mesh *mesh;
  size_t attr_count;
  _Bool should_use_quads;
  size_t vertex_count;
  _Bool has_tex_coords;
  hash_table *phStack_28;
  _Bool has_normals;
  hash_table *index_table;
  size_t quad_count;
  size_t tri_count;
  obj_model *model_local;
  
  quad_count = 0;
  index_table = (hash_table *)0x0;
  tri_count = (size_t)model;
  count_primitives(model,&quad_count,(size_t *)&index_table);
  phStack_28 = new_hash_table(0x18,8);
  vertex_count._7_1_ = 0;
  vertex_count._6_1_ = 0;
  sVar7 = compute_unique_vertices
                    ((obj_model *)tri_count,phStack_28,(_Bool *)((long)&vertex_count + 7),
                     (_Bool *)((long)&vertex_count + 6));
  sVar8 = 4;
  if ((vertex_count._6_1_ & 1) != 0) {
    sVar8 = 5;
  }
  mesh_00 = new_mesh(TRI_MESH,quad_count,sVar7,obj_attr_types,obj_attr_bindings,sVar8);
  pvVar1 = mesh_00->attrs->data;
  pvVar2 = mesh_00->attrs[1].data;
  if ((vertex_count._6_1_ & 1) == 0) {
    local_108 = (void *)0x0;
  }
  else {
    local_108 = mesh_00->attrs[mesh_00->attr_count - 1].data;
  }
  n = 0;
  uVar3 = phStack_28->cap;
  for (; n < uVar3; n = n + 1) {
    _Var6 = is_bucket_occupied(phStack_28,n);
    if (_Var6) {
      lVar4 = *(long *)((long)phStack_28->values + n * 8);
      plVar9 = (long *)((long)phStack_28->keys + n * 0x18);
      puVar10 = (undefined8 *)((long)pvVar1 + lVar4 * 0xc);
      puVar11 = (undefined8 *)(*(long *)(tri_count + 0x18) + *plVar9 * 0xc);
      *puVar10 = *puVar11;
      *(undefined4 *)(puVar10 + 1) = *(undefined4 *)(puVar11 + 1);
      if ((vertex_count._7_1_ & 1) != 0) {
        puVar10 = (undefined8 *)((long)pvVar2 + lVar4 * 0xc);
        puVar11 = (undefined8 *)(*(long *)(tri_count + 0x20) + plVar9[1] * 0xc);
        *puVar10 = *puVar11;
        *(undefined4 *)(puVar10 + 1) = *(undefined4 *)(puVar11 + 1);
      }
      if ((vertex_count._6_1_ & 1) != 0) {
        *(undefined8 *)((long)local_108 + lVar4 * 8) =
             *(undefined8 *)(*(long *)(tri_count + 0x28) + plVar9[2] * 8);
      }
    }
  }
  k = 0;
  n_1 = 0;
  uVar3 = *(ulong *)(tri_count + 0x38);
  while( true ) {
    if (uVar3 <= k) {
      free_hash_table(phStack_28);
      recompute_geometry_normals(mesh_00);
      if ((vertex_count._7_1_ & 1) == 0) {
        recompute_shading_normals(mesh_00);
      }
      return mesh_00;
    }
    plVar9 = (long *)(*(long *)(tri_count + 8) + k * 0x10);
    if ((ulong)plVar9[1] < 3) break;
    sVar7 = translate_obj_index(phStack_28,
                                (obj_index *)(*(long *)(tri_count + 0x10) + *plVar9 * 0x18));
    j_1 = translate_obj_index(phStack_28,
                              (obj_index *)(*(long *)(tri_count + 0x10) + (*plVar9 + 1) * 0x18));
    m_1 = 2;
    uVar5 = plVar9[1];
    for (; m_1 < uVar5; m_1 = m_1 + 1) {
      if (mesh_00->primitive_count <= n_1) {
        __assert_fail("k < mesh->primitive_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/import_obj.c"
                      ,0x78,"struct mesh *build_mesh_from_obj_model(const struct obj_model *)");
      }
      sVar8 = translate_obj_index(phStack_28,
                                  (obj_index *)
                                  (*(long *)(tri_count + 0x10) + (*plVar9 + m_1) * 0x18));
      mesh_00->indices[n_1 * 3] = sVar7;
      mesh_00->indices[n_1 * 3 + 1] = j_1;
      mesh_00->indices[n_1 * 3 + 2] = sVar8;
      n_1 = n_1 + 1;
      j_1 = sVar8;
    }
    k = k + 1;
  }
  __assert_fail("face->index_count >= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/import_obj.c"
                ,0x65,"struct mesh *build_mesh_from_obj_model(const struct obj_model *)");
}

Assistant:

static struct mesh* build_mesh_from_obj_model(const struct obj_model* model) {
    size_t tri_count = 0, quad_count = 0;
    count_primitives(model, &tri_count, &quad_count);

    struct hash_table* index_table = new_hash_table(sizeof(struct obj_index), sizeof(size_t));
    bool has_normals = false, has_tex_coords = false;
    size_t vertex_count = compute_unique_vertices(model, index_table, &has_normals, &has_tex_coords);

    // TODO: Debug this
    //bool should_use_quads = sizeof(struct quad) * quad_count <= sizeof(struct tri) * tri_count;
    bool should_use_quads = false;
    size_t attr_count = has_tex_coords ? ARRAY_SIZE(obj_attr_bindings) : ARRAY_SIZE(obj_attr_bindings) - 1;
    struct mesh* mesh = new_mesh(
        should_use_quads ? QUAD_MESH : TRI_MESH,
        should_use_quads ? quad_count : tri_count,
        vertex_count, obj_attr_types, obj_attr_bindings, attr_count);

    // Copy vertices from the model into the mesh
    struct vec3* vertices   = mesh->attrs[ATTR_POSITION].data;
    struct vec3* normals    = mesh->attrs[ATTR_SHADING_NORMAL].data;
    struct vec2* tex_coords = has_tex_coords ? mesh->attrs[mesh->attr_count - 1].data : NULL;
    for (size_t i = 0, n = index_table->cap; i < n; ++i) {
        if (!is_bucket_occupied(index_table, i))
            continue;
        size_t j = ((size_t*)index_table->values)[i];
        struct obj_index* obj_index = &((struct obj_index*)index_table->keys)[i];
        vertices[j] = model->vertices[obj_index->v];
        if (has_normals)    normals[j]    = model->normals[obj_index->n];
        if (has_tex_coords) tex_coords[j] = model->tex_coords[obj_index->t];
    }

    // Compute face indices
    for (size_t i = 0, k = 0, n = model->face_count; i < n; ++i) {
        const struct obj_face* face = &model->faces[i];
        assert(face->index_count >= 3);
        size_t i0 = translate_obj_index(index_table, &model->indices[face->first_index + 0]);
        size_t i1 = translate_obj_index(index_table, &model->indices[face->first_index + 1]);
        if (should_use_quads) {
            for (size_t j = 2, m = face->index_count; j < m; j += 2) {
                assert(k < mesh->primitive_count);
                size_t i2 = translate_obj_index(index_table, &model->indices[face->first_index + j]);
                size_t i3 = i2;
                if (j + 1 < face->index_count) 
                    i3 = translate_obj_index(index_table, &model->indices[face->first_index + j + 1]);
                mesh->indices[k * 4 + 0] = i0;
                mesh->indices[k * 4 + 1] = i1;
                mesh->indices[k * 4 + 2] = i2;
                mesh->indices[k * 4 + 3] = i3;
                i1 = i3;
                k++;
            }
        } else {
            for (size_t j = 2, m = face->index_count; j < m; ++j) {
                assert(k < mesh->primitive_count);
                size_t i2 = translate_obj_index(index_table, &model->indices[face->first_index + j]);
                mesh->indices[k * 3 + 0] = i0;
                mesh->indices[k * 3 + 1] = i1;
                mesh->indices[k * 3 + 2] = i2;
                i1 = i2;
                k++;
            }
        }
    }
    free_hash_table(index_table);
    recompute_geometry_normals(mesh);
    if (!has_normals)
        recompute_shading_normals(mesh);
    return mesh;
}